

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O2

void FCanvasTextureInfo::Serialize(FArchive *arc)

{
  AActor *pAVar1;
  FArchive *pFVar2;
  FCanvasTextureInfo **ppFVar3;
  AActor *nullactor;
  FTextureID picnum;
  int fov;
  AActor *local_30;
  FTextureID local_28;
  DWORD local_24;
  
  if (arc->m_Storing == true) {
    ppFVar3 = &List;
    while (ppFVar3 = &((FCanvasTextureInfo *)ppFVar3)->Next->Next,
          (FCanvasTextureInfo *)ppFVar3 != (FCanvasTextureInfo *)0x0) {
      if (((FCanvasTextureInfo *)ppFVar3)->Texture != (FCanvasTexture *)0x0) {
        pAVar1 = GC::ReadBarrier<AActor>((AActor **)&((FCanvasTextureInfo *)ppFVar3)->Viewpoint);
        if (pAVar1 != (AActor *)0x0) {
          pFVar2 = ::operator<<(arc,(AActor **)&((FCanvasTextureInfo *)ppFVar3)->Viewpoint);
          pFVar2 = FArchive::operator<<(pFVar2,(DWORD *)&((FCanvasTextureInfo *)ppFVar3)->FOV);
          ::operator<<(pFVar2,&((FCanvasTextureInfo *)ppFVar3)->PicNum);
        }
      }
    }
    local_30 = (AActor *)0x0;
    ::operator<<(arc,&local_30);
  }
  else {
    EmptyList();
    while( true ) {
      ::operator<<(arc,&local_30);
      if (local_30 == (AActor *)0x0) break;
      pFVar2 = FArchive::operator<<(arc,&local_24);
      ::operator<<(pFVar2,&local_28);
      Add(local_30,local_28,local_24);
    }
  }
  return;
}

Assistant:

void FCanvasTextureInfo::Serialize (FArchive &arc)
{
	if (arc.IsStoring ())
	{
		FCanvasTextureInfo *probe;

		for (probe = List; probe != NULL; probe = probe->Next)
		{
			if (probe->Texture != NULL && probe->Viewpoint != NULL)
			{
				arc << probe->Viewpoint << probe->FOV << probe->PicNum;
			}
		}
		AActor *nullactor = NULL;
		arc << nullactor;
	}
	else
	{
		AActor *viewpoint;
		int fov;
		FTextureID picnum;
		
		EmptyList ();
		while (arc << viewpoint, viewpoint != NULL)
		{
			arc << fov << picnum;
			Add (viewpoint, picnum, fov);
		}
	}
}